

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O1

bool __thiscall QFSFileEnginePrivate::flushFh(QFSFileEnginePrivate *this)

{
  int iVar1;
  QAbstractFileEngine *this_00;
  int iVar2;
  int *piVar3;
  long in_FS_OFFSET;
  bool bVar4;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->lastFlushFailed == false) {
    this_00 = (this->super_QAbstractFileEnginePrivate).q_ptr;
    iVar2 = fflush((FILE *)this->fh);
    this->lastFlushFailed = iVar2 != 0;
    this->lastIOCommand = IOFlushCommand;
    if (iVar2 != 0) {
      piVar3 = __errno_location();
      iVar1 = *piVar3;
      QSystemError::stdString(&local_40,*piVar3);
      QAbstractFileEngine::setError(this_00,(uint)(iVar1 == 0x1c) * 2 + WriteError,&local_40);
      if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    bVar4 = iVar2 == 0;
  }
  else {
    bVar4 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QFSFileEnginePrivate::flushFh()
{
    Q_Q(QFSFileEngine);

    // Never try to flush again if the last flush failed. Otherwise you can
    // get crashes on some systems (AIX).
    if (lastFlushFailed)
        return false;

    int ret = fflush(fh);

    lastFlushFailed = (ret != 0);
    lastIOCommand = QFSFileEnginePrivate::IOFlushCommand;

    if (ret != 0) {
        q->setError(errno == ENOSPC ? QFile::ResourceError : QFile::WriteError,
                    QSystemError::stdString(errno));
        return false;
    }
    return true;
}